

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O0

QStringList * QProcess::splitCommand(QStringView command)

{
  QChar c;
  QChar c_00;
  bool bVar1;
  bool bVar2;
  qsizetype qVar3;
  QStringList *in_RDI;
  long in_FS_OFFSET;
  int i;
  bool inQuote;
  int quoteCount;
  QStringList *args;
  QString tmp;
  parameter_type in_stack_ffffffffffffff68;
  QList<QString> *in_stack_ffffffffffffff70;
  undefined6 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 in_stack_ffffffffffffff7f;
  int local_50;
  int local_48;
  QChar local_34;
  char16_t local_32;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QString>::QList((QList<QString> *)0x792508);
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x792536);
  local_48 = 0;
  bVar2 = false;
  for (local_50 = 0; qVar3 = QStringView::size(&local_18), local_50 < qVar3; local_50 = local_50 + 1
      ) {
    local_32 = (char16_t)
               QStringView::at((QStringView *)
                               CONCAT17(in_stack_ffffffffffffff7f,
                                        CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78
                                                )),(qsizetype)in_stack_ffffffffffffff70);
    QChar::QChar<char16_t,_true>(&local_34,L'\"');
    bVar1 = ::operator==((QChar *)in_stack_ffffffffffffff70,(QChar *)in_stack_ffffffffffffff68);
    if (bVar1) {
      local_48 = local_48 + 1;
      if (local_48 == 3) {
        local_48 = 0;
        QStringView::at((QStringView *)
                        CONCAT17(in_stack_ffffffffffffff7f,
                                 CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78)),
                        (qsizetype)in_stack_ffffffffffffff70);
        c.ucs._1_1_ = in_stack_ffffffffffffff7f;
        c.ucs._0_1_ = in_stack_ffffffffffffff7e;
        QString::operator+=((QString *)in_stack_ffffffffffffff70,c);
      }
    }
    else {
      if (local_48 != 0) {
        if (local_48 == 1) {
          bVar2 = (bool)(bVar2 ^ 1);
        }
        local_48 = 0;
      }
      in_stack_ffffffffffffff7f = false;
      if (!bVar2) {
        QStringView::at((QStringView *)
                        (ulong)CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78),
                        (qsizetype)in_stack_ffffffffffffff70);
        in_stack_ffffffffffffff7f = QChar::isSpace((QChar *)0x792672);
      }
      if ((bool)in_stack_ffffffffffffff7f == false) {
        QStringView::at((QStringView *)
                        (ulong)CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78),
                        (qsizetype)in_stack_ffffffffffffff70);
        c_00.ucs._1_1_ = in_stack_ffffffffffffff7f;
        c_00.ucs._0_1_ = in_stack_ffffffffffffff7e;
        QString::operator+=((QString *)in_stack_ffffffffffffff70,c_00);
      }
      else {
        bVar1 = QString::isEmpty((QString *)0x79268a);
        if (!bVar1) {
          QList<QString>::operator+=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
          QString::clear((QString *)in_stack_ffffffffffffff70);
        }
      }
    }
  }
  bVar2 = QString::isEmpty((QString *)0x7926f5);
  if (!bVar2) {
    QList<QString>::operator+=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  QString::~QString((QString *)0x79271b);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QProcess::splitCommand(QStringView command)
{
    QStringList args;
    QString tmp;
    int quoteCount = 0;
    bool inQuote = false;

    // handle quoting. tokens can be surrounded by double quotes
    // "hello world". three consecutive double quotes represent
    // the quote character itself.
    for (int i = 0; i < command.size(); ++i) {
        if (command.at(i) == u'"') {
            ++quoteCount;
            if (quoteCount == 3) {
                // third consecutive quote
                quoteCount = 0;
                tmp += command.at(i);
            }
            continue;
        }
        if (quoteCount) {
            if (quoteCount == 1)
                inQuote = !inQuote;
            quoteCount = 0;
        }
        if (!inQuote && command.at(i).isSpace()) {
            if (!tmp.isEmpty()) {
                args += tmp;
                tmp.clear();
            }
        } else {
            tmp += command.at(i);
        }
    }
    if (!tmp.isEmpty())
        args += tmp;

    return args;
}